

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-mon-lore.c
# Opt level: O0

void lore_show_subwindow(monster_race *race,monster_lore *lore)

{
  textblock *tb_00;
  textblock *tb;
  wchar_t y;
  monster_lore *lore_local;
  monster_race *race_local;
  
  if ((race != (monster_race *)0x0) && (lore != (monster_lore *)0x0)) {
    for (tb._4_4_ = L'\0'; tb._4_4_ < Term->hgt; tb._4_4_ = tb._4_4_ + L'\x01') {
      Term_erase(L'\0',tb._4_4_,L'ÿ');
    }
    tb_00 = textblock_new();
    lore_description(tb_00,race,lore,false);
    textui_textblock_place(tb_00,(region_conflict)ZEXT816((ulong)0),(char *)0x0);
    textblock_free(tb_00);
    return;
  }
  __assert_fail("race && lore",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-mon-lore.c"
                ,200,
                "void lore_show_subwindow(const struct monster_race *, const struct monster_lore *)"
               );
}

Assistant:

void lore_show_subwindow(const struct monster_race *race,
						 const struct monster_lore *lore)
{
	int y;
	textblock *tb;

	assert(race && lore);

	/* Erase the window, since textui_textblock_place() only clears what it
	 * needs */
	for (y = 0; y < Term->hgt; y++)
		Term_erase(0, y, 255);

	tb = textblock_new();
	lore_description(tb, race, lore, false);
	textui_textblock_place(tb, SCREEN_REGION, NULL);
	textblock_free(tb);
}